

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_test.c
# Opt level: O0

void basic_tests(zt_unit_test *test,void *data)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *str;
  char *pcVar5;
  char *suffix;
  char *pcVar6;
  void *pvVar7;
  ssize_t sVar8;
  int *piVar9;
  zt_unit_test *in_RDI;
  char *msg_100;
  char *msg_99;
  char *msg_98;
  char *msg_97;
  char *msg_96;
  char *msg_95;
  char *msg_94;
  char *msg_93;
  char *msg_92;
  char *msg_91;
  char *msg_90;
  char *msg_89;
  char *msg_88;
  char *msg_87;
  char *msg_86;
  char *msg_85;
  char *msg_84;
  char *msg_83;
  char *msg_82;
  char *msg_81;
  char *msg_80;
  char *msg_79;
  char *msg_78;
  char *msg_77;
  char *msg_76;
  char *msg_75;
  char *msg_74;
  char *msg_73;
  char *msg_72;
  char *msg_71;
  char *msg_70;
  char *msg_69;
  char *msg_68;
  char *msg_67;
  char *msg_66;
  char *msg_65;
  char *msg_64;
  char *msg_63;
  char *msg_62;
  char *msg_61;
  char *msg_60;
  char *msg_59;
  char *msg_58;
  char *msg_57;
  char *msg_56;
  char *msg_55;
  char *msg_54;
  char *msg_53;
  char *msg_52;
  char *msg_51;
  char *msg_50;
  char *msg_49;
  char *msg_48;
  char *msg_47;
  char *msg_46;
  char *msg_45;
  char *msg_44;
  char *msg_43;
  char *msg_42;
  char *msg_41;
  char *msg_40;
  char *msg_39;
  char *msg_38;
  char *msg_37;
  char *msg_36;
  char *msg_35;
  char *msg_34;
  char *msg_33;
  char *msg_32;
  char *msg_31;
  char *msg_30;
  char *msg_29;
  char *msg_28;
  char *msg_27;
  char *msg_26;
  char *msg_25;
  char *msg_24;
  char *msg_23;
  char *msg_22;
  char *msg_21;
  char *msg_20;
  char *msg_19;
  char *msg_18;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  char dname [4097];
  char bname [4097];
  zt_ptr_array *cut_array;
  zt_ptr_array *split_array;
  char *split_test;
  char hex2 [41];
  char digest [20];
  char *hex;
  char *free_me2;
  char *free_me;
  char *spain;
  char *iface_str;
  char *path;
  char *alpha;
  char *AHPLA;
  char *ALPHA;
  char *strip_test;
  char *chomp_test;
  char test_string1 [7];
  char *in_stack_ffffffffffffdbc8;
  ssize_t sVar10;
  char *in_stack_ffffffffffffdbd0;
  char *in_stack_ffffffffffffdbd8;
  char *in_stack_ffffffffffffdbe0;
  char *in_stack_ffffffffffffdbf0;
  char *in_stack_ffffffffffffdbf8;
  ssize_t in_stack_ffffffffffffdc00;
  char *in_stack_ffffffffffffdc08;
  ssize_t in_stack_ffffffffffffdc10;
  char *in_stack_ffffffffffffdc18;
  char *in_stack_ffffffffffffdc20;
  ssize_t in_stack_ffffffffffffdc28;
  char *in_stack_ffffffffffffdc30;
  ssize_t in_stack_ffffffffffffdc38;
  ssize_t in_stack_ffffffffffffdc40;
  char *in_stack_ffffffffffffdc48;
  char *in_stack_ffffffffffffdcf8;
  char *in_stack_ffffffffffffdd00;
  ssize_t in_stack_ffffffffffffdd08;
  ssize_t in_stack_ffffffffffffdd10;
  char *in_stack_ffffffffffffdd18;
  char local_20e8 [4112];
  char local_10d8 [4104];
  zt_ptr_array *local_d0;
  zt_ptr_array *local_c8;
  char *local_c0;
  char local_b8 [48];
  undefined1 local_88 [24];
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char local_17 [15];
  zt_unit_test *local_8;
  
  builtin_strncpy(local_17,"  Ok \n",7);
  local_8 = in_RDI;
  local_20 = strdup(local_17);
  local_28 = strdup(local_17);
  local_30 = "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  local_38 = "ZYXWVUTSRQPONMLKJIHGFEDCBA";
  local_40 = "abcdefghijklmnopqrstuvwxyz";
  local_48 = "/home/jshiffer/config.foo";
  local_50 = "Interface";
  local_58 = "The rain in Spain";
  local_70 = "34aa973cd4c4daa4f61FFB2BDBAD27316534016FXXX";
  local_c0 = "/a/b/c/d/";
  zt_cstr_chomp(in_stack_ffffffffffffdbd0);
  sVar3 = strlen(local_20);
  if (sVar3 != 5) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(strlen(chomp_test) == 5)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x2c);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  zt_cstr_strip(in_stack_ffffffffffffdbe0);
  sVar3 = strlen(local_28);
  if (sVar3 != 3) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(strlen(strip_test) == 3)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x2f);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_rspn(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0);
  if (sVar4 != 2) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_cstr_rspn(test_string1, \"\\n \") == 2)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x31);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  str = (char *)zt_cstr_rspn(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0);
  pcVar5 = (char *)strlen(local_17);
  if (str != pcVar5) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_cstr_rspn(test_string1, \"Ok\\n \") == strlen(test_string1))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x33);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar5 = (char *)zt_cstr_rcspn(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0);
  sVar3 = strlen(local_17);
  if (pcVar5 != (char *)(sVar3 - 1)) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_cstr_rcspn(test_string1, \"QRZ\\nno\") == strlen(test_string1) - 1)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x36);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  suffix = (char *)zt_cstr_rcspn(in_stack_ffffffffffffdbd8,in_stack_ffffffffffffdbd0);
  pcVar6 = (char *)strlen(local_17);
  if (suffix != pcVar6) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_cstr_rcspn(test_string1, \"Q\") == strlen(test_string1))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x38);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  local_c8 = zt_cstr_split(in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
  if (local_c8 == (zt_ptr_array *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(split_array != ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x3b);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_c8,0);
  iVar2 = strcmp(pcVar6,"a");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(split_array, 0), \"a\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x3d);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_c8,1);
  iVar2 = strcmp(pcVar6,"b");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(split_array, 1), \"b\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x3f);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_c8,2);
  iVar2 = strcmp(pcVar6,"c");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(split_array, 2), \"c\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x41);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_c8,3);
  iVar2 = strcmp(pcVar6,"d");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(split_array, 3), \"d\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x43);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pvVar7 = zt_ptr_array_get_idx(local_c8,4);
  if (pvVar7 != (void *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_ptr_array_get_idx(split_array, 4) == ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x44);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_split_free((zt_ptr_array *)0x10d576);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(zt_cstr_split_free(split_array) == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x45);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  local_d0 = zt_cstr_cut(str,(int)((ulong)pcVar5 >> 0x20),(int)pcVar5);
  if (local_d0 == (zt_ptr_array *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(cut_array != ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x48);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,0);
  iVar2 = strcmp(pcVar6,"/a/b/c/d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 0), \"/a/b/c/d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x4b);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,1);
  iVar2 = strcmp(pcVar6,"/b/c/d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 1), \"/b/c/d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x4e);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,2);
  iVar2 = strcmp(pcVar6,"/c/d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 2), \"/c/d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x51);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,3);
  iVar2 = strcmp(pcVar6,"/d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 3), \"/d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x53);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pvVar7 = zt_ptr_array_get_idx(local_d0,4);
  if (pvVar7 != (void *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_ptr_array_get_idx(cut_array, 4) == ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x54);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_cut_free((zt_ptr_array *)0x10d9c1);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(zt_cstr_cut_free(cut_array) == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x55);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  local_d0 = zt_cstr_cut(str,(int)((ulong)pcVar5 >> 0x20),(int)pcVar5);
  if (local_d0 == (zt_ptr_array *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(cut_array != ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x58);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,0);
  iVar2 = strcmp(pcVar6,"a/b/c/d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 0), \"a/b/c/d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x5b);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,1);
  iVar2 = strcmp(pcVar6,"b/c/d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 1), \"b/c/d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x5e);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,2);
  iVar2 = strcmp(pcVar6,"c/d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 2), \"c/d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x61);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,3);
  iVar2 = strcmp(pcVar6,"d/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 3), \"d/\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,99);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pvVar7 = zt_ptr_array_get_idx(local_d0,4);
  if (pvVar7 != (void *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_ptr_array_get_idx(cut_array, 4) == ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,100);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_cut_free((zt_ptr_array *)0x10de09);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(zt_cstr_cut_free(cut_array) == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x65);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  local_d0 = zt_cstr_tok(in_stack_ffffffffffffdc08,(int)((ulong)in_stack_ffffffffffffdc00 >> 0x20),
                         (int)in_stack_ffffffffffffdc00);
  if (local_d0 == (zt_ptr_array *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(cut_array != ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x68);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,0);
  iVar2 = strcmp(pcVar6,"/a/b/c/d");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 0), \"/a/b/c/d\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x6b);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,1);
  iVar2 = strcmp(pcVar6,"/a/b/c");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 1), \"/a/b/c\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x6e);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,2);
  iVar2 = strcmp(pcVar6,"/a/b");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 2), \"/a/b\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x71);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = (char *)zt_ptr_array_get_idx(local_d0,3);
  iVar2 = strcmp(pcVar6,"/a");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp((const char *)zt_ptr_array_get_idx(cut_array, 3), \"/a\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x73);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pvVar7 = zt_ptr_array_get_idx(local_d0,4);
  if (pvVar7 != (void *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(zt_ptr_array_get_idx(cut_array, 4) == ((void*)0))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x74);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_cut_free((zt_ptr_array *)0x10e251);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(zt_cstr_cut_free(cut_array) == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x75);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  zt_cstr_basename(in_stack_ffffffffffffdbf0,(size_t)str,pcVar5,suffix);
  iVar2 = strcmp(local_10d8,"config.foo");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(!strcmp(bname, \"config.foo\"))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x79);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  zt_cstr_basename(in_stack_ffffffffffffdbf0,(size_t)str,pcVar5,suffix);
  iVar2 = strcmp(local_10d8,"config");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(!strcmp(bname, \"config\"))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x7b);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  zt_cstr_basename(in_stack_ffffffffffffdbf0,(size_t)str,pcVar5,suffix);
  iVar2 = strcmp(local_10d8,"c:\\Windows\\System32\\");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(!strcmp(bname, \"c:\\\\Windows\\\\System32\\\\\"))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x7e);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  zt_cstr_dirname(str,(size_t)pcVar5,suffix);
  iVar2 = strcmp(local_20e8,"/home/jshiffer");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(!strcmp(dname, \"/home/jshiffer\"))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x81);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  zt_cstr_dirname(str,(size_t)pcVar5,suffix);
  iVar2 = strcmp(local_10d8,"/foo/bar");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(!strcmp(bname, \"/foo/bar\"))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x84);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  local_60 = zt_cstr_path_append(in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc18);
  iVar2 = strcmp(local_60,"/foo/bar/baz/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "strcmp(free_me = zt_cstr_path_append(\"/foo/bar\", \"baz/\"), \"/foo/bar/baz/\") == 0"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x87);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_path_append(in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc18);
  iVar2 = strcmp(local_60,"/foo/bar/baz/");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "strcmp(free_me = zt_cstr_path_append(\"/foo/bar\", \"/baz/\"), \"/foo/bar/baz/\") == 0"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x8c);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  zt_cstr_dirname(str,(size_t)pcVar5,suffix);
  iVar2 = strcmp(local_20e8,".");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","(!strcmp(dname, \".\"))",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x90);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  free(local_28);
  free(local_20);
  _Var1 = zt_cstr_abspath(in_stack_ffffffffffffdbc8);
  if (!_Var1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_abspath(PATH_SEPERATOR \"tmp\") == true",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x9a);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  _Var1 = zt_cstr_abspath(in_stack_ffffffffffffdbc8);
  if (!_Var1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_abspath(\".\" PATH_SEPERATOR \"tmp\") == true",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x9b);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  _Var1 = zt_cstr_abspath(in_stack_ffffffffffffdbc8);
  if (_Var1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_abspath(\"tmp\") == false",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x9c);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  local_60 = zt_cstr_sub(in_stack_ffffffffffffdbf0,(ssize_t)str,(ssize_t)pcVar5);
  iVar2 = strcmp(local_60,"face");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_sub(iface_str, 5, 8), \"face\") == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x9f);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_sub(in_stack_ffffffffffffdbf0,(ssize_t)str,(ssize_t)pcVar5);
  iVar2 = strcmp(local_60,"face");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_sub(iface_str, 5, -1), \"face\") == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xa2);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_sub(in_stack_ffffffffffffdbf0,(ssize_t)str,(ssize_t)pcVar5);
  iVar2 = strcmp(local_60,"face");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_sub(iface_str, -4, 8), \"face\") == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xa5);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_sub(in_stack_ffffffffffffdbf0,(ssize_t)str,(ssize_t)pcVar5);
  iVar2 = strcmp(local_60,"face");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_sub(iface_str, -4, -1), \"face\") == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xa8);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_sub(in_stack_ffffffffffffdbf0,(ssize_t)str,(ssize_t)pcVar5);
  iVar2 = strcmp(local_60,"fac");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_sub(iface_str, -4, -2), \"fac\") == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xab);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  sVar10 = 0;
  local_60 = zt_cstr_catv(local_50,0xfffffffc,0xffffffff," plant",0);
  iVar2 = strcmp(local_60,"face plant");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_catv(iface_str, -4, -1, \" plant\", 0, -1, NULL), \"face plant\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xb0);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_cat(in_stack_ffffffffffffdc20,(ssize_t)in_stack_ffffffffffffdc18,
                         in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc08,
                         in_stack_ffffffffffffdc00,(ssize_t)in_stack_ffffffffffffdbf8);
  iVar2 = strcmp(local_60,"face plant");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_cat(iface_str, -4, -1, \" plant\", 0, -1), \"face plant\") == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xb5);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_map(in_stack_ffffffffffffdd18,in_stack_ffffffffffffdd10,
                         in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
                         in_stack_ffffffffffffdcf8);
  iVar2 = strcmp(local_60,local_40);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_map(ALPHA, 0, -1, ALPHA, alpha), alpha) == 0)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xba);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_map(in_stack_ffffffffffffdd18,in_stack_ffffffffffffdd10,
                         in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
                         in_stack_ffffffffffffdcf8);
  iVar2 = strcmp(local_60,local_30);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_map(ALPHA, 0, -1, NULL, NULL), ALPHA) == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xbe);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  pcVar6 = zt_cstr_map(in_stack_ffffffffffffdd18,in_stack_ffffffffffffdd10,in_stack_ffffffffffffdd08
                       ,in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
  if (pcVar6 != (char *)0x0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_map(NULL, 0, -1, NULL, NULL) == NULL",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xc1);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  local_60 = zt_cstr_reverse(in_stack_ffffffffffffdbf0,(ssize_t)str,(ssize_t)pcVar5);
  iVar2 = strcmp(local_60,local_38);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_reverse(ALPHA, 0, -1), AHPLA) == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xc4);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_dup(in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc00,
                         (ssize_t)in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0);
  iVar2 = strcmp(local_60,local_30);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "(strcmp(free_me = zt_cstr_dup(ALPHA, 0, -1, 1), ALPHA) == 0)",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,200);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  local_60 = zt_cstr_dup(in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc00,
                         (ssize_t)in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0);
  local_68 = zt_cstr_cat(in_stack_ffffffffffffdc20,(ssize_t)in_stack_ffffffffffffdc18,
                         in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc08,
                         in_stack_ffffffffffffdc00,(ssize_t)in_stack_ffffffffffffdbf8);
  iVar2 = strcmp(local_60,local_68);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","strcmp(free_me, free_me2) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xcd);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  if (local_60 != (char *)0x0) {
    free(local_60);
    local_60 = (char *)0x0;
  }
  if (local_68 != (char *)0x0) {
    free(local_68);
    local_68 = (char *)0x0;
  }
  sVar8 = zt_cstr_find(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != -1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_find(spain, 0, -1, \"\") == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd1);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_find(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != 2) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_find(spain, 0, -1, \"e\") == 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd2);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_find(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != 4) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_find(spain, 0, -1, \"rain\") == 4",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd3);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_find(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != 6) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_find(spain, 0, -1, \"in\") == 6",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd4);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_find(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != 0xc) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_find(spain, 0, -1, \"Spain\") == 12",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd5);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_find(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != -1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_find(spain, 0, -1, \"zqb\") == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd6);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rfind(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                        pcVar5);
  if (sVar8 != -1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rfind(spain, 0, -1, \"\") == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd8);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rfind(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                        pcVar5);
  if (sVar8 != 2) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rfind(spain, 0, -1, \"e\") == 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xd9);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rfind(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                        pcVar5);
  if (sVar8 != 4) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rfind(spain, 0, -1, \"rain\") == 4"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xda);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rfind(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                        pcVar5);
  if (sVar8 != 0xf) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rfind(spain, 0, -1, \"in\") == 15",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xdb);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rfind(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                        pcVar5);
  if (sVar8 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rfind(spain, 0, -1, \"The\") == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xdc);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rfind(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                        pcVar5);
  if (sVar8 != -1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rfind(spain, 0, -1, \"zqb\") == -1"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xdd);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_any(str,(ssize_t)pcVar5,(ssize_t)suffix,in_stack_ffffffffffffdbd0);
  if (sVar8 != 0xc) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_any(spain, 0, -1, \"zqbS\") == 12",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xdf);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_any(str,(ssize_t)pcVar5,(ssize_t)suffix,in_stack_ffffffffffffdbd0);
  if (sVar8 != -1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_any(spain, 0, -1, \"zqb\") == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xe0);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rany(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != 0xc) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rany(spain, 0, -1, \"zqbS\") == 12"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xe2);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar8 = zt_cstr_rany(in_stack_ffffffffffffdbf8,(ssize_t)in_stack_ffffffffffffdbf0,(ssize_t)str,
                       pcVar5);
  if (sVar8 != -1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rany(spain, 0, -1, \"zqb\") == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xe3);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  pcVar6 = local_50;
  sVar4 = zt_cstr_pos(local_50,sVar10);
  iVar2 = strcmp(pcVar6 + sVar4,"face");
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "strcmp(&iface_str[zt_cstr_pos(iface_str, -4)], \"face\") == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xe6);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_len(pcVar5,(ssize_t)suffix,(ssize_t)pcVar6);
  if (sVar4 != 4) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_len(iface_str, -4, -1) == 4",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xe8);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_cmp(in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38,
                      in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc28,
                      (ssize_t)in_stack_ffffffffffffdc20);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_cmp(iface_str, -4, -1, iface_str, 5, 8) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xea);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_cmp(in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38,
                      in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc28,
                      (ssize_t)in_stack_ffffffffffffdc20);
  if (iVar2 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_cmp(iface_str, 0, -1, iface_str, 0, -1) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xeb);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_cmp(in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38,
                      in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc28,
                      (ssize_t)in_stack_ffffffffffffdc20);
  if (iVar2 != 1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_cmp(iface_str, 0, -1, iface_str, 0, 4) == 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xec);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  iVar2 = zt_cstr_cmp(in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc38,
                      in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc28,
                      (ssize_t)in_stack_ffffffffffffdc20);
  if (iVar2 != -1) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_cstr_cmp(iface_str, 0, 4, iface_str, 0, -1) == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xed);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_chr(str,(ssize_t)pcVar5,(ssize_t)suffix,(int)((ulong)pcVar6 >> 0x20));
  if (sVar4 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_chr(iface_str, 0, -1, \'i\') == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xf0);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_rchr(str,(ssize_t)pcVar5,(ssize_t)suffix,(int)((ulong)pcVar6 >> 0x20));
  if (sVar4 != 0) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rchr(iface_str, 0, -1, \'i\') == 0"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xf1);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_chr(str,(ssize_t)pcVar5,(ssize_t)suffix,(int)((ulong)pcVar6 >> 0x20));
  if (sVar4 != 3) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_chr(iface_str, 0, -1, \'e\') == 3",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xf3);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_rchr(str,(ssize_t)pcVar5,(ssize_t)suffix,(int)((ulong)pcVar6 >> 0x20));
  if (sVar4 != 8) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rchr(iface_str, 0, -1, \'e\') == 8"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xf4);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_chr(str,(ssize_t)pcVar5,(ssize_t)suffix,(int)((ulong)pcVar6 >> 0x20));
  if (sVar4 != 4) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_chr(iface_str, 0, -1, \'r\') == 4",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xf6);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar4 = zt_cstr_rchr(str,(ssize_t)pcVar5,(ssize_t)suffix,(int)((ulong)pcVar6 >> 0x20));
  if (sVar4 != 4) {
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_cstr_rchr(iface_str, 0, -1, \'r\') == 4"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0xf7);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  zt_unit_test_add_assertion(local_8);
  sVar10 = zt_cstr_upto(str,(ssize_t)pcVar5,(ssize_t)suffix,pcVar6);
  if (sVar10 == -1) {
    zt_unit_test_add_assertion(local_8);
    sVar10 = zt_cstr_upto(str,(ssize_t)pcVar5,(ssize_t)suffix,pcVar6);
    if (sVar10 != 0) {
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                             "zt_cstr_upto(iface_str, 0, -1, \"AIb\") == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0xfa);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    zt_unit_test_add_assertion(local_8);
    sVar10 = zt_cstr_upto(str,(ssize_t)pcVar5,(ssize_t)suffix,pcVar6);
    if (sVar10 != 4) {
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                             "zt_cstr_upto(iface_str, 0, -1, \"far\") == 4",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0xfb);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    zt_unit_test_add_assertion(local_8);
    sVar10 = zt_cstr_rupto(str,(ssize_t)pcVar5,(ssize_t)suffix,pcVar6);
    if (sVar10 != -1) {
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                             "zt_cstr_rupto(iface_str, 0, -1, \"xyz\") == -1",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0xfd);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    zt_unit_test_add_assertion(local_8);
    sVar10 = zt_cstr_rupto(str,(ssize_t)pcVar5,(ssize_t)suffix,pcVar6);
    if (sVar10 != 0) {
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                             "zt_cstr_rupto(iface_str, 0, -1, \"AIb\") == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0xfe);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    zt_unit_test_add_assertion(local_8);
    sVar10 = zt_cstr_rupto(str,(ssize_t)pcVar5,(ssize_t)suffix,pcVar6);
    if (sVar10 != 8) {
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                             "zt_cstr_rupto(iface_str, 0, -1, \"aeb\") == 8",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0xff);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    zt_unit_test_add_assertion(local_8);
    sVar10 = zt_cstr_rupto(str,(ssize_t)pcVar5,(ssize_t)suffix,pcVar6);
    if (sVar10 != 4) {
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                             "zt_cstr_rupto(iface_str, 0, -1, \"ntr\") == 4",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x100);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    zt_unit_test_add_assertion(local_8);
    sVar4 = zt_hex_to_binary(in_stack_ffffffffffffdbf8,(size_t)in_stack_ffffffffffffdbf0,str,
                             (size_t)pcVar5);
    if (sVar4 != 0x14) {
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","zt_hex_to_binary(hex, 40, NULL, 0) == 20"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x102);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    zt_unit_test_add_assertion(local_8);
    sVar4 = zt_hex_to_binary(in_stack_ffffffffffffdbf8,(size_t)in_stack_ffffffffffffdbf0,str,
                             (size_t)pcVar5);
    if (sVar4 == 0x14) {
      zt_unit_test_add_assertion(local_8);
      sVar4 = zt_hex_to_binary(in_stack_ffffffffffffdbf8,(size_t)in_stack_ffffffffffffdbf0,str,
                               (size_t)pcVar5);
      if (sVar4 != 0) {
        iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                               "zt_hex_to_binary(hex, 43, digest, 23) == 0",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                               ,0x105);
        if (iVar2 == 0) {
          local_8->error = (char *)0x0;
        }
        longjmp((__jmp_buf_tag *)local_8->env,1);
      }
      zt_unit_test_add_assertion(local_8);
      piVar9 = __errno_location();
      if (*piVar9 != 0x16) {
        iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","errno == EINVAL",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                               ,0x106);
        if (iVar2 == 0) {
          local_8->error = (char *)0x0;
        }
        longjmp((__jmp_buf_tag *)local_8->env,1);
      }
      zt_unit_test_add_assertion(local_8);
      sVar4 = zt_binary_to_hex(local_88,0x14,local_b8,0x29);
      if (sVar4 != 0x28) {
        iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                               "zt_binary_to_hex(digest, 20, hex2, 41) == 40",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                               ,0x108);
        if (iVar2 == 0) {
          local_8->error = (char *)0x0;
        }
        longjmp((__jmp_buf_tag *)local_8->env,1);
      }
      zt_unit_test_add_assertion(local_8);
      local_60 = zt_cstr_map(in_stack_ffffffffffffdd18,in_stack_ffffffffffffdd10,
                             in_stack_ffffffffffffdd08,in_stack_ffffffffffffdd00,
                             in_stack_ffffffffffffdcf8);
      iVar2 = memcmp(local_b8,local_60,0x28);
      if (iVar2 == 0) {
        zt_unit_test_add_assertion(local_8);
        if (local_60 != (char *)0x0) {
          free(local_60);
          local_60 = (char *)0x0;
        }
        sVar4 = zt_hex_to_binary(in_stack_ffffffffffffdbf8,(size_t)in_stack_ffffffffffffdbf0,str,
                                 (size_t)pcVar5);
        if (sVar4 == 0) {
          zt_unit_test_add_assertion(local_8);
          piVar9 = __errno_location();
          if (*piVar9 == 0x16) {
            zt_unit_test_add_assertion(local_8);
            return;
          }
          iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","errno == EINVAL",
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                                 ,0x10e);
          if (iVar2 == 0) {
            local_8->error = (char *)0x0;
          }
          longjmp((__jmp_buf_tag *)local_8->env,1);
        }
        iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                               "zt_hex_to_binary(\"AX\", 2, digest, 1) == 0",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                               ,0x10d);
        if (iVar2 == 0) {
          local_8->error = (char *)0x0;
        }
        longjmp((__jmp_buf_tag *)local_8->env,1);
      }
      iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d","memcmp(hex2, free_me, 40) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x10a);
      if (iVar2 == 0) {
        local_8->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)local_8->env,1);
    }
    iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                           "zt_hex_to_binary(hex, 40, digest, 23) == 20",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x103);
    if (iVar2 == 0) {
      local_8->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)local_8->env,1);
  }
  iVar2 = zt_unit_printf(&local_8->error,"%s : %s:%d",
                         "zt_cstr_upto(iface_str, 0, -1, \"xyz\") == -1",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                         ,0xf9);
  if (iVar2 == 0) {
    local_8->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)local_8->env,1);
}

Assistant:

static void
basic_tests(struct zt_unit_test *test, void *data UNUSED)
{
    list_elt * al;
    list_elt * al2;

    zt_elist_t * volatile tmp;
    zt_elist_t * tmp2;

    size_t       i;

    zt_elist(list1);
    zt_elist(list2);

    ZT_UNIT_ASSERT(test, list1.prev == &list1);
    ZT_UNIT_ASSERT(test, list1.next == &list1);

    for (i = 0; i < sizeof_array(values); i++) {
        al = zt_calloc(list_elt, 1);
        al->value = values[i];

        zt_elist_add(&list1, &al->list);

        al = zt_calloc(list_elt, 1);
        al->value = (int)(VALUES_MAX - values[i]);

        zt_elist_add(&list2, &al->list);
    }

    tmp2 = &list2;
    zt_elist_for_each(&list1, tmp) {
        tmp2 = zt_elist_get_next(tmp2);

        al = zt_elist_data(tmp, list_elt, list);
        al2 = zt_elist_data(tmp2, list_elt, list);

        ZT_UNIT_ASSERT(test, al->value + al2->value == 9);

    }

    zt_elist_for_each_safe(&list1, tmp, tmp2) {
        al = zt_elist_data(tmp, list_elt, list);
        zt_free(al);
    }

    zt_elist_for_each_safe(&list2, tmp, tmp2) {
        al = zt_elist_data(tmp, list_elt, list);
        zt_free(al);
    }
}